

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten(QSocks5SocketEnginePrivate *this)

{
  long lVar1;
  QSocks5SocketEnginePrivate *in_RDI;
  
  if ((in_RDI->socks5State == Connected) &&
     (((in_RDI->mode != ConnectMode ||
       (lVar1 = (**(code **)(*(long *)&in_RDI->data->controlSocket->super_QAbstractSocket + 0xa8))()
       , lVar1 == 0)) &&
      (lVar1 = (**(code **)(*(long *)&in_RDI->data->controlSocket->super_QAbstractSocket + 0xa8))(),
      lVar1 < 0x20000)))) {
    emitWriteNotification(in_RDI);
    in_RDI->writeNotificationActivated = false;
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten()
{
    QSOCKS5_DEBUG << "_q_controlSocketBytesWritten";

    if (socks5State != Connected
        || (mode == ConnectMode
        && data->controlSocket->bytesToWrite()))
        return;
    if (data->controlSocket->bytesToWrite() < MaxWriteBufferSize) {
        emitWriteNotification();
        writeNotificationActivated = false;
    }
}